

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O1

int Abc_NtkIsAcyclicHierarchy(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if ((pNtk->ntkType == ABC_NTK_NETLIST) && (pNtk->pDesign != (Abc_Des_t *)0x0)) {
    pVVar1 = pNtk->pDesign->vModules;
    lVar4 = (long)pVVar1->nSize;
    if (0 < lVar4) {
      ppvVar2 = pVVar1->pArray;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)ppvVar2[lVar5] + 0xc0) = 0;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pNtk->fHiePath = 1;
    iVar3 = Abc_NtkIsAcyclicHierarchy_rec(pNtk);
    pNtk->fHiePath = 0;
    pVVar1 = pNtk->pDesign->vModules;
    lVar4 = (long)pVVar1->nSize;
    if (0 < lVar4) {
      ppvVar2 = pVVar1->pArray;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)ppvVar2[lVar5] + 0xc0) = 0;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    return iVar3;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk) && pNtk->pDesign",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcCheck.c"
                ,0x332,"int Abc_NtkIsAcyclicHierarchy(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclicHierarchy( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp;
    int i, RetValue;
    assert( Abc_NtkIsNetlist(pNtk) && pNtk->pDesign );
    // clear the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = pTemp->fHiePath = 0;
    // traverse
    pNtk->fHiePath = 1;
    RetValue = Abc_NtkIsAcyclicHierarchy_rec( pNtk );
    pNtk->fHiePath = 0;
    // clear the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = pTemp->fHiePath = 0;
    return RetValue;
}